

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_lambda_t(basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,type2 *t)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  *this_00;
  pointer *__ptr;
  
  (this->type1_)._M_t.
  super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  .
  super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
  ._M_head_impl =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)0x0;
  this_00 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
             *)operator_new(0x20);
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  ::function(this_00,t);
  (this->type2_)._M_t.
  super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
  .
  super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
  ._M_head_impl = this_00;
  return;
}

Assistant:

basic_lambda_t(const type2& t) : type2_(new type2(t)) {}